

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_functions.cpp
# Opt level: O0

void Am_Insert_JChar_At_Cursor(Am_Object *text,char c,bool advance_cursor)

{
  bool bVar1;
  int iVar2;
  Am_Value *pAVar3;
  char *pcVar4;
  Am_Object local_128;
  Am_Object local_120;
  int local_114;
  int boin_1;
  Am_Object local_108;
  Am_Object local_100;
  Am_Object local_f8;
  Am_Object local_f0;
  Am_Object local_e8;
  Am_Object local_e0;
  Am_Object local_d8;
  Am_Object local_d0;
  Am_Object local_c8;
  Am_Object local_c0;
  Am_Object local_b8;
  Am_Object local_b0;
  undefined4 local_a4;
  Am_Object local_a0;
  int local_98;
  int local_94;
  int shiin;
  int boin;
  Am_Object local_88;
  Am_Object local_80;
  Am_Object local_78;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  byte local_49;
  bool eucf;
  Am_String old_str;
  Am_Object local_28;
  int local_1c;
  int local_18;
  int head_pos;
  int cursor_index;
  bool advance_cursor_local;
  char c_local;
  Am_Object *text_local;
  
  head_pos._2_1_ = advance_cursor;
  head_pos._3_1_ = c;
  _cursor_index = text;
  pAVar3 = Am_Object::Get(text,0xad,0);
  local_18 = Am_Value::operator_cast_to_int(pAVar3);
  Am_Object::Am_Object(&local_28,text);
  iVar2 = ml_head_pos(&local_28);
  Am_Object::~Am_Object(&local_28);
  if (local_18 < iVar2) {
    return;
  }
  local_1c = iVar2;
  pAVar3 = Am_Object::Get(text,0xe4,0);
  bVar1 = Am_Value::operator_cast_to_bool(pAVar3);
  if (bVar1) {
    Am_Object::Am_Object((Am_Object *)&old_str,text);
    Am_Delete_Entire_String((Am_Object *)&old_str);
    Am_Object::~Am_Object((Am_Object *)&old_str);
  }
  pAVar3 = Am_Object::Get(text,0xab,0);
  Am_String::Am_String((Am_String *)&stack0xffffffffffffffb8,pAVar3);
  pcVar4 = Am_String::operator_cast_to_char_((Am_String *)&stack0xffffffffffffffb8);
  local_49 = ((int)*pcVar4 & 0x80U) != 0;
  if (local_18 < local_1c + 2) {
    switch(head_pos._3_1_) {
    case 'a':
      local_114 = 0;
      break;
    default:
      Am_Object::Am_Object(&local_120,text);
      pcVar4 = to_correct_code(onetotwo[head_pos._3_1_],(bool)(local_49 & 1));
      Am_Insert_String_At_Cursor(&local_120,pcVar4,(bool)(head_pos._2_1_ & 1));
      Am_Object::~Am_Object(&local_120);
      local_a4 = 1;
      goto LAB_0027a6b9;
    case 'e':
      local_114 = 3;
      break;
    case 'i':
      local_114 = 1;
      break;
    case 'o':
      local_114 = 4;
      break;
    case 'u':
      local_114 = 2;
    }
    Am_Object::Am_Object(&local_128,text);
    pcVar4 = to_correct_code(rktab[0][local_114],(bool)(local_49 & 1));
    Am_Insert_String_At_Cursor(&local_128,pcVar4,(bool)(head_pos._2_1_ & 1));
    Am_Object::~Am_Object(&local_128);
  }
  else {
    local_18 = local_18 + -2;
    if (head_pos._3_1_ == 'n') {
      pcVar4 = Am_String::operator_cast_to_char_((Am_String *)&stack0xffffffffffffffb8);
      iVar2 = jcomp(pcVar4 + local_18,onetotwo[0x6e]);
      if (iVar2 == 0) {
        Am_Object::Am_Object(&local_58,text);
        Am_Delete_Char_Before_Cursor(&local_58);
        Am_Object::~Am_Object(&local_58);
        Am_Object::Am_Object(&local_60,text);
        pcVar4 = to_correct_code(n_Japanese,(bool)(local_49 & 1));
        Am_Insert_String_At_Cursor(&local_60,pcVar4,(bool)(head_pos._2_1_ & 1));
        Am_Object::~Am_Object(&local_60);
        goto LAB_0027a6af;
      }
    }
    if ((((head_pos._3_1_ != 'a') && (head_pos._3_1_ != 'e')) && (head_pos._3_1_ != 'i')) &&
       (((head_pos._3_1_ != 'o' && (head_pos._3_1_ != 'u')) &&
        ((head_pos._3_1_ != 'h' && (head_pos._3_1_ != 'y')))))) {
      pcVar4 = Am_String::operator_cast_to_char_((Am_String *)&stack0xffffffffffffffb8);
      iVar2 = jcomp(pcVar4 + local_18,onetotwo[0x6e]);
      if (iVar2 == 0) {
        Am_Object::Am_Object(&local_68,text);
        Am_Delete_Char_Before_Cursor(&local_68);
        Am_Object::~Am_Object(&local_68);
        Am_Object::Am_Object(&local_70,text);
        pcVar4 = to_correct_code(n_Japanese,(bool)(local_49 & 1));
        Am_Insert_String_At_Cursor(&local_70,pcVar4,true);
        Am_Object::~Am_Object(&local_70);
        Am_Object::Am_Object(&local_78,text);
        pcVar4 = to_correct_code(onetotwo[head_pos._3_1_],(bool)(local_49 & 1));
        Am_Insert_String_At_Cursor(&local_78,pcVar4,(bool)(head_pos._2_1_ & 1));
        Am_Object::~Am_Object(&local_78);
        goto LAB_0027a6af;
      }
    }
    if (((('a' < head_pos._3_1_) && (head_pos._3_1_ < '{')) &&
        ((head_pos._3_1_ != 'a' &&
         (((head_pos._3_1_ != 'e' && (head_pos._3_1_ != 'i')) && (head_pos._3_1_ != 'o')))))) &&
       (head_pos._3_1_ != 'u')) {
      pcVar4 = Am_String::operator_cast_to_char_((Am_String *)&stack0xffffffffffffffb8);
      iVar2 = jcomp(pcVar4 + local_18,onetotwo[head_pos._3_1_]);
      if (iVar2 == 0) {
        Am_Object::Am_Object(&local_80,text);
        Am_Move_Cursor_Left(&local_80);
        Am_Object::~Am_Object(&local_80);
        Am_Object::Am_Object(&local_88,text);
        pcVar4 = to_correct_code(small_tsu,(bool)(local_49 & 1));
        Am_Insert_String_At_Cursor(&local_88,pcVar4,true);
        Am_Object::~Am_Object(&local_88);
        if ((head_pos._2_1_ & 1) != 0) {
          Am_Object::Am_Object((Am_Object *)&shiin,text);
          Am_Move_Cursor_Right((Am_Object *)&shiin);
          Am_Object::~Am_Object((Am_Object *)&shiin);
        }
        goto LAB_0027a6af;
      }
    }
    switch(head_pos._3_1_) {
    case 'a':
      local_94 = 0;
      break;
    default:
      Am_Object::Am_Object(&local_a0,text);
      pcVar4 = to_correct_code(onetotwo[head_pos._3_1_],(bool)(local_49 & 1));
      Am_Insert_String_At_Cursor(&local_a0,pcVar4,(bool)(head_pos._2_1_ & 1));
      Am_Object::~Am_Object(&local_a0);
      local_a4 = 1;
      goto LAB_0027a6b9;
    case 'e':
      local_94 = 3;
      break;
    case 'i':
      local_94 = 1;
      break;
    case 'o':
      local_94 = 4;
      break;
    case 'u':
      local_94 = 2;
    }
    pcVar4 = Am_String::operator_cast_to_char_((Am_String *)&stack0xffffffffffffffb8);
    iVar2 = jcomp(pcVar4 + local_18,onetotwo[0x79]);
    if (iVar2 == 0) {
      if (local_1c + 2 <= local_18) {
        pcVar4 = Am_String::operator_cast_to_char_((Am_String *)&stack0xffffffffffffffb8);
        local_98 = isalpha_2(pcVar4 + (local_18 + -2));
        if (0 < local_98) {
          Am_Object::Am_Object(&local_b0,text);
          Am_Delete_Char_Before_Cursor(&local_b0);
          Am_Object::~Am_Object(&local_b0);
          Am_Object::Am_Object(&local_b8,text);
          Am_Delete_Char_Before_Cursor(&local_b8);
          Am_Object::~Am_Object(&local_b8);
          Am_Object::Am_Object(&local_c0,text);
          pcVar4 = to_correct_code(*(char **)((long)local_98 * 0x50 + 0x41e888 + (long)local_94 * 8)
                                   ,(bool)(local_49 & 1));
          Am_Insert_String_At_Cursor(&local_c0,pcVar4,(bool)(head_pos._2_1_ & 1));
          Am_Object::~Am_Object(&local_c0);
          goto LAB_0027a6af;
        }
      }
      Am_Object::Am_Object(&local_c8,text);
      Am_Delete_Char_Before_Cursor(&local_c8);
      Am_Object::~Am_Object(&local_c8);
      Am_Object::Am_Object(&local_d0,text);
      pcVar4 = to_correct_code(rktab[0x18][local_94],(bool)(local_49 & 1));
      Am_Insert_String_At_Cursor(&local_d0,pcVar4,(bool)(head_pos._2_1_ & 1));
      Am_Object::~Am_Object(&local_d0);
    }
    else {
      pcVar4 = Am_String::operator_cast_to_char_((Am_String *)&stack0xffffffffffffffb8);
      iVar2 = jcomp(pcVar4 + local_18,onetotwo[0x68]);
      if (iVar2 == 0) {
        if (local_1c + 2 <= local_18) {
          pcVar4 = Am_String::operator_cast_to_char_((Am_String *)&stack0xffffffffffffffb8);
          local_98 = isalpha_2(pcVar4 + (local_18 + -2));
          if (0 < local_98) {
            Am_Object::Am_Object(&local_d8,text);
            Am_Delete_Char_Before_Cursor(&local_d8);
            Am_Object::~Am_Object(&local_d8);
            Am_Object::Am_Object(&local_e0,text);
            Am_Delete_Char_Before_Cursor(&local_e0);
            Am_Object::~Am_Object(&local_e0);
            Am_Object::Am_Object(&local_e8,text);
            pcVar4 = to_correct_code(*(char **)((long)local_98 * 0x50 + 0x41e888 +
                                               (long)local_94 * 8),(bool)(local_49 & 1));
            Am_Insert_String_At_Cursor(&local_e8,pcVar4,(bool)(head_pos._2_1_ & 1));
            Am_Object::~Am_Object(&local_e8);
            goto LAB_0027a6af;
          }
        }
        Am_Object::Am_Object(&local_f0,text);
        Am_Delete_Char_Before_Cursor(&local_f0);
        Am_Object::~Am_Object(&local_f0);
        Am_Object::Am_Object(&local_f8,text);
        pcVar4 = to_correct_code(rktab[7][local_94],(bool)(local_49 & 1));
        Am_Insert_String_At_Cursor(&local_f8,pcVar4,(bool)(head_pos._2_1_ & 1));
        Am_Object::~Am_Object(&local_f8);
      }
      else {
        pcVar4 = Am_String::operator_cast_to_char_((Am_String *)&stack0xffffffffffffffb8);
        local_98 = isalpha_2(pcVar4 + local_18);
        if (local_98 < 1) {
          Am_Object::Am_Object((Am_Object *)&stack0xfffffffffffffef0,text);
          pcVar4 = to_correct_code(rktab[0][local_94],(bool)(local_49 & 1));
          Am_Insert_String_At_Cursor
                    ((Am_Object *)&stack0xfffffffffffffef0,pcVar4,(bool)(head_pos._2_1_ & 1));
          Am_Object::~Am_Object((Am_Object *)&stack0xfffffffffffffef0);
        }
        else {
          Am_Object::Am_Object(&local_100,text);
          Am_Delete_Char_Before_Cursor(&local_100);
          Am_Object::~Am_Object(&local_100);
          Am_Object::Am_Object(&local_108,text);
          pcVar4 = to_correct_code(rktab[local_98][local_94],(bool)(local_49 & 1));
          Am_Insert_String_At_Cursor(&local_108,pcVar4,(bool)(head_pos._2_1_ & 1));
          Am_Object::~Am_Object(&local_108);
        }
      }
    }
  }
LAB_0027a6af:
  local_a4 = 0;
LAB_0027a6b9:
  Am_String::~Am_String((Am_String *)&stack0xffffffffffffffb8);
  return;
}

Assistant:

void
Am_Insert_JChar_At_Cursor(Am_Object text, char c, bool advance_cursor)
{
  int cursor_index = text.Get(Am_CURSOR_INDEX);
  int head_pos = ml_head_pos(text);
  if (cursor_index >= head_pos) {
    if ((bool)text.Get(Am_PENDING_DELETE)) //delete all text first
      Am_Delete_Entire_String(text);
    Am_String old_str = text.Get(Am_TEXT);
    bool eucf = iseuc((const char *)old_str);
    if (cursor_index >= head_pos + 2) {
      cursor_index -= 2;
      if (c == 'n' &&
          jcomp(&((const char *)old_str)[cursor_index], onetotwo['n']) ==
              0) { // case 'nn'
        Am_Delete_Char_Before_Cursor(text);
        Am_Insert_String_At_Cursor(text, to_correct_code(n_Japanese, eucf),
                                   advance_cursor);
      } else if (!isboin(c) && c != 'h' && c != 'y' &&
                 jcomp(&((const char *)old_str)[cursor_index], onetotwo['n']) ==
                     0) { // case 'nt' etc.
        Am_Delete_Char_Before_Cursor(text);
        Am_Insert_String_At_Cursor(text, to_correct_code(n_Japanese, eucf),
                                   true);
        Am_Insert_String_At_Cursor(text, to_correct_code(onetotwo[c], eucf),
                                   advance_cursor);
      } else if (isshiin(c) &&
                 jcomp(&((const char *)old_str)[cursor_index], onetotwo[c]) ==
                     0) { // case 'tt' etc.
        Am_Move_Cursor_Left(text);
        Am_Insert_String_At_Cursor(text, to_correct_code(small_tsu, eucf),
                                   true);
        if (advance_cursor)
          Am_Move_Cursor_Right(text);
      } else { // not 'nn', 'tt' etc.
        int boin, shiin;
        switch (c) {
        case 'a':
          boin = 0;
          break;
        case 'i':
          boin = 1;
          break;
        case 'u':
          boin = 2;
          break;
        case 'e':
          boin = 3;
          break;
        case 'o':
          boin = 4;
          break;
        default: // case only Shiin
          Am_Insert_String_At_Cursor(text, to_correct_code(onetotwo[c], eucf),
                                     advance_cursor);
          return;
        }
        if (jcomp(&((const char *)old_str)[cursor_index], onetotwo['y']) == 0) {
          if (cursor_index >= head_pos + 2 &&
              (shiin = isalpha_2(&((const char *)old_str)[cursor_index - 2])) >
                  0) { //case 'kya' etc.
            Am_Delete_Char_Before_Cursor(text);
            Am_Delete_Char_Before_Cursor(text);
            Am_Insert_String_At_Cursor(
                text, to_correct_code(rktab[shiin][boin + 5], eucf),
                advance_cursor);
          } else { // two alphabets in 'y' case
            Am_Delete_Char_Before_Cursor(text);
            Am_Insert_String_At_Cursor(
                text, to_correct_code(rktab['y' - 'a'][boin], eucf),
                advance_cursor);
          }
        } else if (jcomp(&((const char *)old_str)[cursor_index],
                         onetotwo['h']) == 0) { // case 'kha' etc.
          if (cursor_index >= head_pos + 2 &&
              (shiin = isalpha_2(&((const char *)old_str)[cursor_index - 2])) >
                  0) {
            Am_Delete_Char_Before_Cursor(text);
            Am_Delete_Char_Before_Cursor(text);
            Am_Insert_String_At_Cursor(
                text, to_correct_code(rktab[shiin][boin + 5], eucf),
                advance_cursor);
          } else { // two alphabets in 'h' case
            Am_Delete_Char_Before_Cursor(text);
            Am_Insert_String_At_Cursor(
                text, to_correct_code(rktab['h' - 'a'][boin], eucf),
                advance_cursor);
          }
        } else { // without 'h', 'y'
          if ((shiin = isalpha_2(&((const char *)old_str)[cursor_index])) >
              0) { // case 'ka' etc.
            Am_Delete_Char_Before_Cursor(text);
            Am_Insert_String_At_Cursor(
                text, to_correct_code(rktab[shiin][boin], eucf),
                advance_cursor);
          } else { // case Boin only, such as 'a' etc.
            Am_Insert_String_At_Cursor(
                text, to_correct_code(rktab[0][boin], eucf), advance_cursor);
          }
        }
      }
    } else { // insert to the head of input field
      int boin;
      switch (c) {
      case 'a':
        boin = 0;
        break;
      case 'i':
        boin = 1;
        break;
      case 'u':
        boin = 2;
        break;
      case 'e':
        boin = 3;
        break;
      case 'o':
        boin = 4;
        break;
      default: // case only Shiin
        Am_Insert_String_At_Cursor(text, to_correct_code(onetotwo[c], eucf),
                                   advance_cursor);
        return;
      }
      Am_Insert_String_At_Cursor(text, to_correct_code(rktab[0][boin], eucf),
                                 advance_cursor);
    }
  }
}